

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O3

void CheckStackTraceLeaf(void)

{
  uint uVar1;
  void *__ptr;
  string *psVar2;
  void **v2;
  ulong uVar3;
  void *unaff_retaddr;
  void *stack [10];
  CheckOpString local_f8;
  CheckOpString local_f0;
  LogMessage local_e8;
  void *local_88 [11];
  
  local_88[0] = unaff_retaddr;
  if ((expected_range[1].start < unaff_retaddr) ||
     (psVar2 = google::MakeCheckOpString<void_const*,void*>
                         (&expected_range[1].start,local_88,"(&expected_range[1])->start < ra"),
     psVar2 == (string *)0x0)) {
    if (expected_range[1].end < local_88[0]) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start);
      expected_range[1].end = local_88[0];
    }
    expected_range[0].start = (void *)0x108edf;
    expected_range[0].end = (void *)0x109067;
    uVar1 = google::GetStackTrace(local_88,10,0);
    printf("Obtained %d stack frames.\n",(ulong)uVar1);
    local_f8.str_._0_4_ = 1;
    local_e8.allocated_._0_4_ = uVar1;
    if ((int)uVar1 < 1) {
      psVar2 = google::MakeCheckOpString<int,int>((int *)&local_e8,(int *)&local_f8,"size >= 1");
      if (psVar2 != (string *)0x0) {
        local_f8.str_ = psVar2;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                   ,0x89,&local_f8);
        google::LogMessage::stream(&local_e8);
        goto LAB_001091e2;
      }
    }
    else {
      local_f8.str_._0_4_ = 10;
      if ((10 < uVar1) &&
         (psVar2 = google::MakeCheckOpString<int,int>
                             ((int *)&local_e8,(int *)&local_f8,"size <= STACK_LEN"),
         psVar2 != (string *)0x0)) {
        local_f8.str_ = psVar2;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                   ,0x8a,&local_f8);
        google::LogMessage::stream(&local_e8);
        goto LAB_001091e2;
      }
    }
    __ptr = (void *)backtrace_symbols(local_88,uVar1);
    printf("Obtained %d stack frames.\n",(ulong)uVar1);
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        printf("%s %p\n",*(undefined8 *)((long)__ptr + uVar3 * 8),local_88[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
    free(__ptr);
    v2 = &expected_range[0].end;
    uVar3 = 0;
    while( true ) {
      printf("Backtrace %d: expected: %p..%p  actual: %p ... ",uVar3 & 0xffffffff,
             ((AddressRange *)(v2 + -1))->start,*v2,local_88[uVar3]);
      fflush(_stdout);
      local_f8.str_ = (string *)local_88[uVar3];
      if ((local_f8.str_ < (string *)((AddressRange *)(v2 + -1))->start) &&
         (local_f0.str_ =
               google::MakeCheckOpString<void*,void_const*>
                         (&local_f8.str_,(void **)(v2 + -1),"ret_addr >= range.start"),
         local_f0.str_ != (string *)0x0)) break;
      if (((string *)*v2 < local_f8.str_) &&
         (local_f0.str_ =
               google::MakeCheckOpString<void*,void_const*>
                         (&local_f8.str_,v2,"ret_addr <= range.end"), local_f0.str_ != (string *)0x0
         )) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                   ,0x74,&local_f0);
        google::LogMessage::stream(&local_e8);
        goto LAB_001091e2;
      }
      puts("OK");
      uVar3 = uVar3 + 1;
      v2 = v2 + 2;
      if (uVar3 == 6) {
        return;
      }
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x73,&local_f0);
    google::LogMessage::stream(&local_e8);
  }
  else {
    local_f8.str_ = psVar2;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x84,&local_f8);
    google::LogMessage::stream(&local_e8);
  }
LAB_001091e2:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e8);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTraceLeaf() {
  const int STACK_LEN = 10;
  void* stack[STACK_LEN];
  int size;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);
  INIT_ADDRESS_RANGE(CheckStackTraceLeaf, start, end, &expected_range[0]);
  DECLARE_ADDRESS_LABEL(start);
  size = GetStackTrace(stack, STACK_LEN, 0);
  printf("Obtained %d stack frames.\n", size);
  CHECK_GE(size, 1);
  CHECK_LE(size, STACK_LEN);

  if (true) {
#  ifdef HAVE_EXECINFO_BACKTRACE_SYMBOLS
    char** strings = backtrace_symbols(stack, size);
    printf("Obtained %d stack frames.\n", size);
    for (int i = 0; i < size; i++) {
      printf("%s %p\n", strings[i], stack[i]);
    }

    union {
      void (*p1)(int);
      void* p2;
    } p = {&CheckStackTrace};

    printf("CheckStackTrace() addr: %p\n", p.p2);
    free(strings);
#  endif
  }
  for (int i = 0; i < BACKTRACE_STEPS; i++) {
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ", i,
           expected_range[i].start, expected_range[i].end, stack[i]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[i], expected_range[i]);
    printf("OK\n");
  }
  DECLARE_ADDRESS_LABEL(end);
}